

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_ee4d9::HelpPrinter::printHelp(HelpPrinter *this)

{
  uint uVar1;
  SubCommand *pSVar2;
  void *pvVar3;
  long lVar4;
  StringRef *pSVar5;
  pointer pSVar6;
  StringRef Str;
  CommandLineParser *pCVar7;
  SubCommand *pSVar8;
  raw_ostream *prVar9;
  raw_ostream *prVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  void **ppvVar14;
  long lVar15;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptMap;
  ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
  *this_00;
  ulong uVar16;
  ulong uVar17;
  StringRef *pSVar18;
  SmallPtrSetIteratorImpl SVar19;
  iterator iVar20;
  pair<const_char_*,_llvm::cl::SubCommand_*> local_1070;
  iterator __begin1;
  StrSubCommandPairVector Subs;
  StrOptionPairVector Opts;
  
  pCVar7 = llvm::
           ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                         *)this);
  pSVar2 = pCVar7->ActiveSubCommand;
  OptMap = &pSVar2->OptionsMap;
  Opts.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_>.
  super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>.
  super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
  super_SmallVectorBase.BeginX =
       &Opts.super_SmallVectorStorage<std::pair<const_char_*,_llvm::cl::Option_*>,_128U>;
  Opts.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_>.
  super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>.
  super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
  super_SmallVectorBase.Size = 0;
  Opts.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_>.
  super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>.
  super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  sortOpts(OptMap,&Opts.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_>,
           this->ShowHidden);
  Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>.
  super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>.
  super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
  super_SmallVectorBase.BeginX =
       &Subs.super_SmallVectorStorage<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_128U>;
  Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>.
  super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>.
  super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
  super_SmallVectorBase.Size = 0;
  Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>.
  super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>.
  super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  pCVar7 = llvm::
           ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                         *)OptMap);
  SVar19 = (SmallPtrSetIteratorImpl)
           llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                     (&(pCVar7->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>
                     );
  __begin1.super_SmallPtrSetIteratorImpl = SVar19;
  iVar20 = llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                     (&(pCVar7->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>
                     );
  ppvVar14 = SVar19.Bucket;
  while (ppvVar14 != iVar20.super_SmallPtrSetIteratorImpl.Bucket) {
    pSVar8 = llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*(&__begin1);
    if ((pSVar8->Name).Length != 0) {
      local_1070.first = (pSVar8->Name).Data;
      local_1070.second = pSVar8;
      llvm::SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>::
      push_back((SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true> *)
                &Subs,&local_1070);
    }
    llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++(&__begin1);
    ppvVar14 = __begin1.super_SmallPtrSetIteratorImpl.Bucket;
  }
  this_00 = (ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
             *)Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>.
               super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>.
               super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>
               .super_SmallVectorBase.BeginX;
  llvm::array_pod_sort<std::pair<char_const*,llvm::cl::SubCommand*>*>
            ((pair<const_char_*,_llvm::cl::SubCommand_*> *)
             Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>.
             super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>.
             super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
             super_SmallVectorBase.BeginX,
             (pair<const_char_*,_llvm::cl::SubCommand_*> *)
             ((Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>.
               super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>.
               super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>
               .super_SmallVectorBase._8_8_ & 0xffffffff) * 0x10 +
             (long)Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>.
                   super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>
                   .
                   super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>
                   .super_SmallVectorBase.BeginX),SubNameCompare);
  pCVar7 = llvm::
           ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->(this_00);
  if ((pCVar7->ProgramOverview).Length != 0) {
    prVar9 = llvm::outs();
    prVar10 = llvm::raw_ostream::operator<<(prVar9,"OVERVIEW: ");
    pCVar7 = llvm::
             ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
             ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                           *)prVar9);
    prVar9 = llvm::raw_ostream::operator<<(prVar10,pCVar7->ProgramOverview);
    llvm::raw_ostream::operator<<(prVar9,"\n");
  }
  pSVar8 = llvm::
           ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
           ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                        *)llvm::cl::TopLevelSubCommand);
  if (pSVar2 == pSVar8) {
    prVar9 = llvm::outs();
    prVar10 = llvm::raw_ostream::operator<<(prVar9,"USAGE: ");
    pCVar7 = llvm::
             ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
             ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                           *)prVar9);
    llvm::raw_ostream::operator<<(prVar10,&pCVar7->ProgramName);
    if (2 < Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>.
            super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>.
            super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
            super_SmallVectorBase.Size) {
      prVar9 = llvm::outs();
      llvm::raw_ostream::operator<<(prVar9," [subcommand]");
    }
    prVar9 = llvm::outs();
  }
  else {
    if ((pSVar2->Description).Length != 0) {
      prVar9 = llvm::outs();
      prVar9 = llvm::raw_ostream::operator<<(prVar9,"SUBCOMMAND \'");
      prVar9 = llvm::raw_ostream::operator<<(prVar9,pSVar2->Name);
      prVar9 = llvm::raw_ostream::operator<<(prVar9,"\': ");
      prVar9 = llvm::raw_ostream::operator<<(prVar9,pSVar2->Description);
      llvm::raw_ostream::operator<<(prVar9,"\n\n");
    }
    prVar9 = llvm::outs();
    prVar10 = llvm::raw_ostream::operator<<(prVar9,"USAGE: ");
    pCVar7 = llvm::
             ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
             ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                           *)prVar9);
    prVar9 = llvm::raw_ostream::operator<<(prVar10,&pCVar7->ProgramName);
    prVar9 = llvm::raw_ostream::operator<<(prVar9," ");
    prVar9 = llvm::raw_ostream::operator<<(prVar9,pSVar2->Name);
  }
  llvm::raw_ostream::operator<<(prVar9," [options]");
  pvVar3 = (pSVar2->PositionalOpts).super_SmallVectorImpl<llvm::cl::Option_*>.
           super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
           super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.super_SmallVectorBase.BeginX;
  uVar1 = (pSVar2->PositionalOpts).super_SmallVectorImpl<llvm::cl::Option_*>.
          super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
          super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.super_SmallVectorBase.Size;
  for (lVar15 = 0; (ulong)uVar1 << 3 != lVar15; lVar15 = lVar15 + 8) {
    lVar4 = *(long *)((long)pvVar3 + lVar15);
    if (*(long *)(lVar4 + 0x20) != 0) {
      prVar9 = llvm::outs();
      prVar9 = llvm::raw_ostream::operator<<(prVar9," --");
      llvm::raw_ostream::operator<<(prVar9,*(StringRef *)(lVar4 + 0x18));
    }
    prVar9 = llvm::outs();
    prVar9 = llvm::raw_ostream::operator<<(prVar9," ");
    llvm::raw_ostream::operator<<(prVar9,*(StringRef *)(lVar4 + 0x28));
  }
  if (pSVar2->ConsumeAfterOpt != (Option *)0x0) {
    prVar9 = llvm::outs();
    prVar9 = llvm::raw_ostream::operator<<(prVar9," ");
    llvm::raw_ostream::operator<<(prVar9,pSVar2->ConsumeAfterOpt->HelpStr);
  }
  pSVar8 = llvm::
           ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
           ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                        *)llvm::cl::TopLevelSubCommand);
  pvVar3 = Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>.
           super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>.
           super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
           super_SmallVectorBase.BeginX;
  if ((pSVar2 == pSVar8) &&
     (uVar16 = Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>.
               super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>.
               super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>
               .super_SmallVectorBase._8_8_ & 0xffffffff, uVar16 != 0)) {
    uVar13 = 0;
    for (lVar15 = 0; uVar16 << 4 != lVar15; lVar15 = lVar15 + 0x10) {
      sVar11 = strlen(*(char **)((long)pvVar3 + lVar15));
      if (uVar13 <= sVar11) {
        uVar13 = sVar11;
      }
    }
    prVar9 = llvm::outs();
    llvm::raw_ostream::operator<<(prVar9,"\n\n");
    prVar9 = llvm::outs();
    llvm::raw_ostream::operator<<(prVar9,"SUBCOMMANDS:\n\n");
    pvVar3 = Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>.
             super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>.
             super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
             super_SmallVectorBase.BeginX;
    uVar16 = Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>.
             super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>.
             super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
             super_SmallVectorBase._8_8_ & 0xffffffff;
    lVar15 = 0;
    while( true ) {
      prVar9 = llvm::outs();
      if (uVar16 << 4 == lVar15) break;
      prVar9 = llvm::raw_ostream::operator<<(prVar9,"  ");
      llvm::raw_ostream::operator<<(prVar9,*(char **)((long)pvVar3 + lVar15));
      if (*(long *)(*(long *)((long)pvVar3 + lVar15 + 8) + 0x18) != 0) {
        prVar9 = llvm::outs();
        sVar11 = strlen(*(char **)((long)pvVar3 + lVar15));
        llvm::raw_ostream::indent(prVar9,(int)uVar13 - (int)sVar11);
        prVar9 = llvm::outs();
        prVar9 = llvm::raw_ostream::operator<<(prVar9," - ");
        llvm::raw_ostream::operator<<
                  (prVar9,*(StringRef *)(*(long *)((long)pvVar3 + lVar15 + 8) + 0x10));
      }
      prVar9 = llvm::outs();
      llvm::raw_ostream::operator<<(prVar9,"\n");
      lVar15 = lVar15 + 0x10;
    }
    llvm::raw_ostream::operator<<(prVar9,"\n");
    prVar9 = llvm::outs();
    prVar10 = llvm::raw_ostream::operator<<(prVar9,"  Type \"");
    pCVar7 = llvm::
             ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
             ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                           *)prVar9);
    prVar9 = llvm::raw_ostream::operator<<(prVar10,&pCVar7->ProgramName);
    llvm::raw_ostream::operator<<
              (prVar9," <subcommand> -help\" to get more help on a specific subcommand");
  }
  prVar9 = llvm::outs();
  llvm::raw_ostream::operator<<(prVar9,"\n\n");
  uVar13 = Opts.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_>.
           super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>.
           super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
           super_SmallVectorBase._8_8_ & 0xffffffff;
  lVar15 = 8;
  uVar16 = 0;
  uVar17 = 0;
  while( true ) {
    if (uVar13 == uVar17) {
      prVar9 = llvm::outs();
      llvm::raw_ostream::operator<<(prVar9,"OPTIONS:\n");
      (**this->_vptr_HelpPrinter)(this,&Opts,uVar16);
      pCVar7 = llvm::
               ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
               ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                             *)this);
      pSVar5 = (pCVar7->MoreHelp).
               super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pSVar18 = (pCVar7->MoreHelp).
                     super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                     super__Vector_impl_data._M_start; pSVar18 != pSVar5; pSVar18 = pSVar18 + 1) {
        Str = *pSVar18;
        this = (HelpPrinter *)llvm::outs();
        llvm::raw_ostream::operator<<((raw_ostream *)this,Str);
      }
      pCVar7 = llvm::
               ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
               ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                             *)this);
      pSVar6 = (pCVar7->MoreHelp).
               super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pCVar7->MoreHelp).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
          _M_impl.super__Vector_impl_data._M_finish != pSVar6) {
        (pCVar7->MoreHelp).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
        _M_impl.super__Vector_impl_data._M_finish = pSVar6;
      }
      llvm::SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>::~SmallVectorImpl
                (&Subs.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::SubCommand_*>_>);
      llvm::SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_>::~SmallVectorImpl
                (&Opts.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_>);
      return;
    }
    if ((Opts.super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_>.
         super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>.
         super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
         super_SmallVectorBase._8_8_ & 0xffffffff) <= uVar17) break;
    uVar12 = (**(code **)(**(long **)((long)Opts.
                                            super_SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_>
                                            .
                                            super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>
                                            .
                                            super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>
                                            .super_SmallVectorBase.BeginX + lVar15) + 0x28))();
    if (uVar16 <= uVar12) {
      uVar16 = uVar12;
    }
    uVar17 = uVar17 + 1;
    lVar15 = lVar15 + 0x10;
  }
  __assert_fail("idx < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x9b,
                "reference llvm::SmallVectorTemplateCommon<std::pair<const char *, llvm::cl::Option *>>::operator[](size_type) [T = std::pair<const char *, llvm::cl::Option *>]"
               );
}

Assistant:

void printHelp() {
    SubCommand *Sub = GlobalParser->getActiveSubCommand();
    auto &OptionsMap = Sub->OptionsMap;
    auto &PositionalOpts = Sub->PositionalOpts;
    auto &ConsumeAfterOpt = Sub->ConsumeAfterOpt;

    StrOptionPairVector Opts;
    sortOpts(OptionsMap, Opts, ShowHidden);

    StrSubCommandPairVector Subs;
    sortSubCommands(GlobalParser->RegisteredSubCommands, Subs);

    if (!GlobalParser->ProgramOverview.empty())
      outs() << "OVERVIEW: " << GlobalParser->ProgramOverview << "\n";

    if (Sub == &*TopLevelSubCommand) {
      outs() << "USAGE: " << GlobalParser->ProgramName;
      if (Subs.size() > 2)
        outs() << " [subcommand]";
      outs() << " [options]";
    } else {
      if (!Sub->getDescription().empty()) {
        outs() << "SUBCOMMAND '" << Sub->getName()
               << "': " << Sub->getDescription() << "\n\n";
      }
      outs() << "USAGE: " << GlobalParser->ProgramName << " " << Sub->getName()
             << " [options]";
    }

    for (auto Opt : PositionalOpts) {
      if (Opt->hasArgStr())
        outs() << " --" << Opt->ArgStr;
      outs() << " " << Opt->HelpStr;
    }

    // Print the consume after option info if it exists...
    if (ConsumeAfterOpt)
      outs() << " " << ConsumeAfterOpt->HelpStr;

    if (Sub == &*TopLevelSubCommand && !Subs.empty()) {
      // Compute the maximum subcommand length...
      size_t MaxSubLen = 0;
      for (size_t i = 0, e = Subs.size(); i != e; ++i)
        MaxSubLen = std::max(MaxSubLen, strlen(Subs[i].first));

      outs() << "\n\n";
      outs() << "SUBCOMMANDS:\n\n";
      printSubCommands(Subs, MaxSubLen);
      outs() << "\n";
      outs() << "  Type \"" << GlobalParser->ProgramName
             << " <subcommand> -help\" to get more help on a specific "
                "subcommand";
    }

    outs() << "\n\n";

    // Compute the maximum argument length...
    size_t MaxArgLen = 0;
    for (size_t i = 0, e = Opts.size(); i != e; ++i)
      MaxArgLen = std::max(MaxArgLen, Opts[i].second->getOptionWidth());

    outs() << "OPTIONS:\n";
    printOptions(Opts, MaxArgLen);

    // Print any extra help the user has declared.
    for (auto I : GlobalParser->MoreHelp)
      outs() << I;
    GlobalParser->MoreHelp.clear();
  }